

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_expression.hpp
# Opt level: O1

BoundUnnestExpression * __thiscall
duckdb::BaseExpression::Cast<duckdb::BoundUnnestExpression>(BaseExpression *this)

{
  InternalException *this_00;
  string local_40;
  
  if (this->expression_class == BOUND_UNNEST) {
    return (BoundUnnestExpression *)this;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Failed to cast expression to type - expression type mismatch","");
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

TARGET &Cast() {
		if (expression_class != TARGET::TYPE) {
			throw InternalException("Failed to cast expression to type - expression type mismatch");
		}
		return reinterpret_cast<TARGET &>(*this);
	}